

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptConditionalExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  TIntermTyped *pTVar2;
  TIntermTyped *local_48;
  TIntermTyped *falseNode;
  TSourceLoc loc;
  TIntermTyped *trueNode;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  bVar1 = acceptBinaryExpression(this,node,PlLogicalOr);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokQuestion);
    if (bVar1) {
      pTVar2 = HlslParseContext::convertConditionalExpression
                         (this->parseContext,&(this->super_HlslTokenStream).token.loc,*node,false);
      *node = pTVar2;
      if (*node == (TIntermTyped *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
             (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + 1;
        loc.column = 0;
        loc._20_4_ = 0;
        bVar1 = acceptExpression(this,(TIntermTyped **)&loc.column);
        if (bVar1) {
          falseNode = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
          loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
          loc.string = (this->super_HlslTokenStream).token.loc.column;
          loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
          bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
          if (bVar1) {
            local_48 = (TIntermTyped *)0x0;
            bVar1 = acceptAssignmentExpression(this,&local_48);
            if (bVar1) {
              (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
                   (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + -1;
              pTVar2 = TIntermediate::addSelection
                                 (this->intermediate,*node,(TIntermTyped *)loc._16_8_,local_48,
                                  (TSourceLoc *)&falseNode);
              *node = pTVar2;
              this_local._7_1_ = true;
            }
            else {
              expected(this,"expression after :");
              this_local._7_1_ = false;
            }
          }
          else {
            expected(this,":");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,"expression after ?");
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptConditionalExpression(TIntermTyped*& node)
{
    // binary_expression
    if (! acceptBinaryExpression(node, PlLogicalOr))
        return false;

    if (! acceptTokenClass(EHTokQuestion))
        return true;

    node = parseContext.convertConditionalExpression(token.loc, node, false);
    if (node == nullptr)
        return false;

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    TIntermTyped* trueNode = nullptr;
    if (! acceptExpression(trueNode)) {
        expected("expression after ?");
        return false;
    }
    TSourceLoc loc = token.loc;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    TIntermTyped* falseNode = nullptr;
    if (! acceptAssignmentExpression(falseNode)) {
        expected("expression after :");
        return false;
    }

    --parseContext.controlFlowNestingLevel;

    node = intermediate.addSelection(node, trueNode, falseNode, loc);

    return true;
}